

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_bench.c
# Opt level: O3

bool_t ecpBench(void)

{
  err_t eVar1;
  u32 seed;
  size_t sVar2;
  size_t sVar3;
  tm_ticks_t tVar4;
  tm_ticks_t tVar5;
  bool_t bVar6;
  long lVar7;
  word *d;
  void *state_00;
  bign_params params [1];
  octet state [6000];
  bign_params local_18f8;
  ec_o local_17a8 [34];
  
  sVar2 = bignStart_keep(0x80,_ecpBench_deep);
  bVar6 = 0;
  if (sVar2 < 0x1771) {
    eVar1 = bignParamsStd(&local_18f8,"1.2.112.0.2.0.34.101.45.3.1");
    bVar6 = 0;
    if (eVar1 == 0) {
      eVar1 = bignStart(local_17a8,&local_18f8);
      if (eVar1 == 0) {
        local_17a8[0].tpl = (ec_tpl_i)0x0;
        state_00 = (void *)((long)&local_17a8[0].hdr.keep + local_17a8[0].hdr.keep);
        sVar3 = prngCOMBO_keep();
        sVar2 = (local_17a8[0].f)->n;
        d = (word *)(sVar3 + (long)state_00) + sVar2 * 2;
        seed = utilNonce32();
        prngCOMBOStart(state_00,seed);
        tVar4 = tmTicks();
        lVar7 = 1000;
        do {
          prngCOMBOStepR(d,(local_17a8[0].f)->no,state_00);
          ecMulA((word *)(sVar3 + (long)state_00),local_17a8[0].base,local_17a8,d,
                 (local_17a8[0].f)->n,d + sVar2);
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
        tVar5 = tmTicks();
        sVar2 = tmSpeed(1000,tVar5 - tVar4);
        printf("ecpBench: %u cycles/mulpoint [%u mulpoints/sec]\n",
               (tVar5 - tVar4) / 1000 & 0xffffffff,sVar2 & 0xffffffff);
        bVar6 = 1;
      }
    }
  }
  return bVar6;
}

Assistant:

bool_t ecpBench()
{
	// описание кривой
	bign_params params[1];
	// состояние
	octet state[6000];
	ec_o* ec;
	octet* combo_state;
	word* pt;
	word* d;
	void* stack;
	// подготовить память
	if (sizeof(state) < bignStart_keep(128, _ecpBench_deep))
		return FALSE;
	// загрузить параметры и создать описание кривой
	if (bignParamsStd(params, "1.2.112.0.2.0.34.101.45.3.1") != ERR_OK ||
		bignStart(state, params) != ERR_OK)
		return FALSE;
	// раскладка состояния
	ec = (ec_o*)state;
	ec->tpl = 0;
	combo_state = objEnd(ec, octet);
	pt = (word*)(combo_state + prngCOMBO_keep());
	d = pt + 2 * ec->f->n;
	stack = d + ec->f->n;
	// создать генератор COMBO
	prngCOMBOStart(combo_state, utilNonce32());
	// оценить число кратных точек в секунду
	{
		const size_t reps = 1000;
		size_t i;
		tm_ticks_t ticks;
		// эксперимент
		for (i = 0, ticks = tmTicks(); i < reps; ++i)
		{
			prngCOMBOStepR(d, ec->f->no, combo_state);
			ecMulA(pt, ec->base, ec, d, ec->f->n, stack);
		}
		ticks = tmTicks() - ticks;
		// печать результатов
		printf("ecpBench: %u cycles/mulpoint [%u mulpoints/sec]\n", 
			(unsigned)(ticks / reps),
			(unsigned)tmSpeed(reps, ticks));
	}
	// все нормально
	return TRUE;
}